

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O1

void __thiscall ManchesterAnalyzer::SynchronizeDifferential(ManchesterAnalyzer *this)

{
  U32 UVar1;
  U32 UVar2;
  iterator iVar3;
  pointer ppVar4;
  pointer puVar5;
  pointer puVar6;
  pointer puVar7;
  long lVar8;
  unsigned_long_long *puVar9;
  U64 location;
  ulong uVar10;
  pointer puVar11;
  ulong uVar12;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> locations_to_save;
  U64 edge_location;
  unsigned_long_long *local_48;
  iterator iStack_40;
  unsigned_long_long *local_38;
  unsigned_long_long local_30;
  
  if (this->mSynchronized == false) {
    do {
      Analyzer::CheckIfThreadShouldExit();
      local_30 = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      location = AnalyzerChannelData::GetSampleNumber();
      uVar10 = location - local_30;
      UVar1 = this->mT;
      UVar2 = this->mTError;
      if (uVar10 < UVar2 + UVar1 && UVar1 - UVar2 < uVar10) {
        iVar3._M_current =
             (this->mUnsyncedLocations).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
          _M_realloc_insert<unsigned_long_long_const&>
                    ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                     &this->mUnsyncedLocations,iVar3,&local_30);
        }
        else {
          *iVar3._M_current = local_30;
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
      }
      else {
        if (uVar10 < UVar2 + UVar1 * 2 && UVar1 * 2 - UVar2 < uVar10) {
          iVar3._M_current =
               (this->mUnsyncedLocations).
               super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
            _M_realloc_insert<unsigned_long_long_const&>
                      ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                       &this->mUnsyncedLocations,iVar3,&local_30);
          }
          else {
            *iVar3._M_current = local_30;
            (this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          this->mSynchronized = true;
          puVar5 = (this->mUnsyncedLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar6 = (this->mUnsyncedLocations).
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_48 = (unsigned_long_long *)0x0;
          iStack_40._M_current = (unsigned_long_long *)0x0;
          local_38 = (unsigned_long_long *)0x0;
          puVar11 = (this->mUnsyncedLocations).
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (puVar11 !=
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_start) {
            do {
              if (iStack_40._M_current == local_38) {
                std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>::
                _M_realloc_insert<unsigned_long_long_const&>
                          ((vector<unsigned_long_long,std::allocator<unsigned_long_long>> *)
                           &local_48,iStack_40,puVar11 + -1);
              }
              else {
                *iStack_40._M_current = puVar11[-1];
                iStack_40._M_current = iStack_40._M_current + 1;
              }
              puVar7 = (this->mUnsyncedLocations).
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              puVar11 = puVar7 + -1;
              (this->mUnsyncedLocations).
              super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
              super__Vector_impl_data._M_finish = puVar11;
              if (puVar11 !=
                  (this->mUnsyncedLocations).
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                (this->mUnsyncedLocations).
                super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
                super__Vector_impl_data._M_finish = puVar7 + -2;
              }
              puVar11 = (this->mUnsyncedLocations).
                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            } while (puVar11 !=
                     (this->mUnsyncedLocations).
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start);
          }
          iVar3._M_current = iStack_40._M_current;
          puVar9 = local_48;
          if (local_48 != iStack_40._M_current) {
            uVar10 = (long)iStack_40._M_current - (long)local_48 >> 3;
            lVar8 = 0x3f;
            if (uVar10 != 0) {
              for (; uVar10 >> lVar8 == 0; lVar8 = lVar8 + -1) {
              }
            }
            std::
            __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_48,iStack_40._M_current,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
            std::
            __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long_long*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (puVar9,iVar3._M_current);
          }
          uVar10 = (ulong)((long)iStack_40._M_current - (long)local_48) >> 3;
          if ((int)uVar10 != 0) {
            uVar12 = 0;
            do {
              SaveBit(this,local_48[uVar12],
                      (uint)(uVar12 == 0 & (byte)((char)puVar5 - (char)puVar6) >> 3));
              uVar12 = uVar12 + 1;
            } while ((uVar10 & 0xffffffff) != uVar12);
          }
          SaveBit(this,location,1);
          if (local_48 == (unsigned_long_long *)0x0) {
            return;
          }
          operator_delete(local_48);
          return;
        }
        this->mSynchronized = false;
        ppVar4 = (this->mBitsForNextByte).
                 super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->mBitsForNextByte).
            super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != ppVar4) {
          (this->mBitsForNextByte).
          super__Vector_base<std::pair<unsigned_long_long,_unsigned_long_long>,_std::allocator<std::pair<unsigned_long_long,_unsigned_long_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = ppVar4;
        }
        puVar5 = (this->mUnsyncedLocations).
                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if ((this->mUnsyncedLocations).
            super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
            super__Vector_impl_data._M_finish != puVar5) {
          (this->mUnsyncedLocations).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = puVar5;
        }
        this->mIgnoreBitCount = ((this->mSettings)._M_ptr)->mBitsToIgnore;
      }
    } while (this->mSynchronized == false);
  }
  return;
}

Assistant:

void ManchesterAnalyzer::SynchronizeDifferential()
{
    while( mSynchronized == false )
    {
        CheckIfThreadShouldExit();
        U64 edge_location = mManchester->GetSampleNumber();
        mManchester->AdvanceToNextEdge();
        U64 next_edge_location = mManchester->GetSampleNumber();
        U64 edge_distance = next_edge_location - edge_location;
        if( ( edge_distance > ( mT - mTError ) ) && ( edge_distance < ( mT + mTError ) ) ) // short
        {
            mUnsyncedLocations.push_back( edge_location );
        }
        else if( ( edge_distance > ( ( 2 * mT ) - mTError ) ) && ( edge_distance < ( ( 2 * mT ) + mTError ) ) ) // long
        {
            mUnsyncedLocations.push_back( edge_location );
            mSynchronized = true;

            bool last_bit_one = false;
            if( mUnsyncedLocations.size() % 2 == 1 )
                last_bit_one = true;
            std::vector<U64> locations_to_save;
            while( mUnsyncedLocations.size() > 0 )
            {
                locations_to_save.push_back( mUnsyncedLocations.back() );
                mUnsyncedLocations.pop_back();
                if( mUnsyncedLocations.size() > 0 )
                    mUnsyncedLocations.pop_back();
            }
            std::sort( locations_to_save.begin(), locations_to_save.end() );
            U32 count = locations_to_save.size();
            for( U32 i = 0; i < count; ++i )
            {
                if( ( i == 0 ) && ( last_bit_one == true ) )
                    SaveBit( locations_to_save[ i ], 1 );
                else
                    SaveBit( locations_to_save[ i ], 0 );
            }

            SaveBit( next_edge_location, 1 );
            break;
        }
        else
        {
            // back to idle.
            Invalidate();
        }
    }
}